

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio.cc
# Opt level: O2

bid_t docio_append_doc_raw(docio_handle *handle,uint64_t size,void *buf)

{
  ushort uVar1;
  bid_t bVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  int iVar7;
  fdb_status fVar8;
  uint64_t uVar9;
  bid_t bVar10;
  bid_t bVar11;
  uint uVar12;
  ulong *puVar13;
  uint64_t uVar14;
  size_t sVar15;
  ulong *puVar16;
  ulong *puVar17;
  ulong *puVar18;
  undefined1 *puVar19;
  undefined8 *puVar20;
  long lVar21;
  fdb_log_levels fVar22;
  filemgr *pfVar23;
  err_log_callback *peVar24;
  char *pcVar25;
  uint32_t uVar26;
  ulong uVar27;
  void *pvVar28;
  uint uVar29;
  ulong uVar30;
  bool bVar31;
  ulong uStack_e8;
  bid_t bStack_e0;
  ulong uStack_d0;
  ulong uStack_c8;
  bid_t local_c0;
  bid_t end;
  uint64_t local_b0;
  ulong local_a8;
  bid_t begin;
  ulong local_98;
  undefined8 uStack_90;
  uint64_t local_88;
  uint64_t local_80;
  ulong *local_78;
  bid_t local_70;
  uint64_t local_68;
  void *local_60;
  ulong local_58;
  ulong local_50;
  bid_t local_48;
  err_log_callback *local_40;
  undefined8 local_32;
  uint8_t marker [1];
  
  peVar24 = handle->log_callback;
  uVar29 = handle->file->blocksize;
  uVar27 = (ulong)uVar29;
  uStack_d0 = 0x10f448;
  local_60 = buf;
  local_32._1_1_ = ver_non_consecutive_doc(handle->file->version);
  local_98 = 0;
  local_b0 = uVar27 - 0x10;
  local_80 = uVar27 - 1;
  local_68 = local_80;
  if ((bool)local_32._1_1_) {
    local_68 = local_b0;
  }
  uStack_90 = 0xdd00000000000000;
  local_32._0_1_ = 0xdd;
  bVar10 = handle->curblock;
  if (bVar10 == 0xffffffffffffffff) {
    uStack_d0 = 0x10f492;
    uVar9 = filemgr_get_sb_bmp_revnum(handle->file);
    handle->cur_bmp_revnum_hash = (uint16_t)uVar9;
    uStack_d0 = 0x10f4a1;
    bVar10 = filemgr_alloc(handle->file,peVar24);
    handle->curblock = bVar10;
    handle->curpos = 0;
  }
  uStack_d0 = 0x10f4b4;
  iVar7 = filemgr_is_writable(handle->file,bVar10);
  uVar12 = handle->curpos;
  local_40 = peVar24;
  local_48 = uVar27;
  if (iVar7 == 0) {
    if (uVar12 < uVar29) {
      uStack_d0 = 0x10f4e2;
      filemgr_mark_stale(handle->file,handle->curblock * uVar27 + (ulong)uVar12,local_68 - uVar12);
    }
    uStack_d0 = 0x10f4ea;
    uVar9 = filemgr_get_sb_bmp_revnum(handle->file);
    handle->cur_bmp_revnum_hash = (uint16_t)uVar9;
    uStack_d0 = 0x10f4f9;
    bVar10 = filemgr_alloc(handle->file,peVar24);
    handle->curblock = bVar10;
    handle->curpos = 0;
    uVar12 = 0;
  }
  peVar24 = local_40;
  uStack_90 = CONCAT62(uStack_90._2_6_,
                       handle->cur_bmp_revnum_hash << 8 | handle->cur_bmp_revnum_hash >> 8);
  uVar27 = (ulong)uVar12;
  uVar30 = local_68 - uVar27;
  if (uVar30 < size) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_68;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = size;
    local_58 = SUB168(auVar5 / auVar4,0);
    iVar7 = SUB164(auVar5 / auVar4,0);
    local_78 = (ulong *)((long)&uStack_c8 - ((ulong)(iVar7 + 1) * 8 + 0xf & 0xfffffffffffffff0));
    puVar13 = (ulong *)((long)local_78 - ((ulong)(iVar7 + 1) * 2 + 0xf & 0xfffffffffffffff0));
    end = (bid_t)puVar13;
    uVar12 = (int)local_68 - uVar12;
    local_50 = (ulong)uVar12;
    uVar29 = SUB164(auVar5 % auVar4,0);
    if (local_32._1_1_ == '\0') {
      pfVar23 = handle->file;
      bVar10 = handle->curblock;
      *(undefined8 *)((long)puVar13 + -8) = 0x10f673;
      bVar11 = filemgr_alloc_multiple_cond
                         (pfVar23,bVar10 + 1,iVar7 + (uint)(uVar12 < uVar29),&local_a8,&local_c0,
                          peVar24);
      bVar2 = local_48;
      bVar10 = handle->curblock;
      if (bVar11 == bVar10 + 1) {
        pfVar23 = handle->file;
        if (local_a8 != bVar11) {
          *(undefined8 *)((long)puVar13 + -0x10) = 2;
          fVar22 = *(fdb_log_levels *)((long)puVar13 + -0x10);
          sVar15 = 0x161;
          fVar8 = FDB_RESULT_SUCCESS;
          *(char **)((long)puVar13 + -0x10) = pfVar23->filename;
          *(bid_t *)((long)puVar13 + -0x18) = bVar11;
          puVar20 = (undefined8 *)((long)puVar13 + -0x20);
          *(char **)((long)puVar13 + -0x20) =
               "Error in allocating blocks starting from block id %lu in a database file \'%s\'";
          goto LAB_0010fac2;
        }
        *(undefined8 *)((long)puVar13 + -0x10) = 1;
        uVar14 = local_80;
        uVar9 = *(uint64_t *)((long)puVar13 + -0x10);
        *(err_log_callback **)((long)puVar13 + -0x10) = peVar24;
        *(undefined8 *)((long)puVar13 + -0x18) = 0x10f6b3;
        fVar8 = filemgr_write_offset
                          (pfVar23,bVar10,uVar14,uVar9,&local_32,false,
                           *(err_log_callback **)((long)puVar13 + -0x10));
        if (fVar8 != FDB_RESULT_SUCCESS) {
          pfVar23 = handle->file;
          pcVar25 = 
          "Error in appending a doc block marker for a block id %lu into a database file \'%s\'";
          *(undefined8 *)((long)puVar13 + -0x10) = 2;
          fVar22 = *(fdb_log_levels *)((long)puVar13 + -0x10);
          sVar15 = 0x16b;
          goto LAB_0010fab3;
        }
        if ((int)local_50 == 0) {
          uVar27 = 0;
        }
        else {
          pfVar23 = handle->file;
          bVar10 = handle->curblock;
          uVar29 = handle->curpos;
          uVar27 = local_50 & 0xffffffff;
          *(undefined8 *)((long)puVar13 + -0x10) = 1;
          pvVar28 = local_60;
          uVar6 = *(undefined8 *)((long)puVar13 + -0x10);
          *(err_log_callback **)((long)puVar13 + -0x10) = peVar24;
          *(undefined8 *)((long)puVar13 + -0x18) = 0x10fc77;
          fVar8 = filemgr_write_offset
                            (pfVar23,bVar10,(ulong)uVar29,uVar27,pvVar28,SUB81(uVar6,0),
                             *(err_log_callback **)((long)puVar13 + -0x10));
          if (fVar8 != FDB_RESULT_SUCCESS) {
            pfVar23 = handle->file;
            *(undefined8 *)((long)puVar13 + -0x10) = 2;
            fVar22 = *(fdb_log_levels *)((long)puVar13 + -0x10);
            sVar15 = 0x177;
            *(char **)((long)puVar13 + -0x10) = pfVar23->filename;
            *(uint64_t *)((long)puVar13 + -0x18) = size;
            puVar17 = (ulong *)((long)puVar13 + -0x20);
            *(ulong *)((long)puVar13 + -0x20) = local_50;
            goto LAB_0010f9a6;
          }
        }
        size = size - uVar27;
        local_48 = local_48 * handle->curblock + (ulong)handle->curpos;
      }
      else {
        if ((bVar10 != 0xffffffffffffffff) && (uVar12 = handle->curpos, uVar12 < (uint)local_48)) {
          pfVar23 = handle->file;
          lVar21 = bVar10 * local_48;
          sVar15 = local_80 - uVar12;
          *(undefined8 *)((long)puVar13 + -8) = 0x10f9e1;
          filemgr_mark_stale(pfVar23,lVar21 + (ulong)uVar12,sVar15);
        }
        pfVar23 = handle->file;
        iVar7 = (int)local_58;
        *(undefined8 *)((long)puVar13 + -8) = 0x10fa08;
        filemgr_alloc_multiple
                  (pfVar23,(iVar7 + 1) - (uint)(uVar29 == 0),&local_a8,&local_c0,peVar24);
        local_48 = bVar2 * local_a8;
        local_50 = 0;
      }
      local_58 = (local_c0 - local_a8) + 1;
      puVar16 = local_78;
      for (; local_c0 + 1 != local_a8; local_a8 = local_a8 + 1) {
        *puVar16 = local_a8;
        puVar16 = puVar16 + 1;
      }
    }
    else {
      local_88 = size;
      local_70 = SUB168(auVar5 % auVar4,0);
      uVar29 = (uint)(uVar12 < uVar29);
      uVar27 = (ulong)(iVar7 + uVar29);
      bVar31 = false;
      for (uVar30 = 0; peVar24 = local_40, bVar10 = local_48, size = local_88, uVar30 < uVar27;
          uVar30 = uVar30 + 1) {
        pfVar23 = handle->file;
        *(undefined8 *)((long)puVar13 + -8) = 0x10f5b0;
        uVar9 = filemgr_get_sb_bmp_revnum(pfVar23);
        peVar24 = local_40;
        *(short *)(end + uVar30 * 2) = (short)uVar9;
        pfVar23 = handle->file;
        *(undefined8 *)((long)puVar13 + -8) = 0x10f5c8;
        bVar10 = filemgr_alloc(pfVar23,peVar24);
        local_78[uVar30] = bVar10;
        if (((uVar30 == 0) &&
            (bVar2 = handle->curblock, bVar3 = bVar2 + 1 < bVar10,
            bVar31 = (bool)(bVar31 | (bVar3 && bVar2 != 0xffffffffffffffff)),
            bVar3 && bVar2 != 0xffffffffffffffff)) && ((int)local_70 != 0)) {
          uVar27 = uVar27 + ((byte)~(byte)uVar29 & 1);
          uVar29 = 1;
          bVar31 = true;
        }
      }
      if ((int)local_50 == 0 || bVar31) {
        if ((handle->curblock != 0xffffffffffffffff) &&
           (uVar29 = handle->curpos, uVar29 < (uint)local_48)) {
          pfVar23 = handle->file;
          lVar21 = handle->curblock * local_48;
          sVar15 = local_68 - uVar29;
          *(undefined8 *)((long)puVar13 + -8) = 0x10f730;
          filemgr_mark_stale(pfVar23,lVar21 + (ulong)uVar29,sVar15);
        }
        local_48 = bVar10 * *local_78;
        local_50 = 0;
        local_58 = uVar27;
      }
      else {
        local_58 = uVar27;
        uVar27 = *local_78;
        local_98 = uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                   (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                   (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                   (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
        pfVar23 = handle->file;
        bVar10 = handle->curblock;
        *(undefined8 *)((long)puVar13 + -0x10) = 0x10;
        peVar24 = local_40;
        uVar14 = local_68;
        uVar9 = *(uint64_t *)((long)puVar13 + -0x10);
        *(err_log_callback **)((long)puVar13 + -0x10) = local_40;
        *(undefined8 *)((long)puVar13 + -0x18) = 0x10fa7e;
        fVar8 = filemgr_write_offset
                          (pfVar23,bVar10,uVar14,uVar9,&local_98,false,
                           *(err_log_callback **)((long)puVar13 + -0x10));
        uVar27 = local_50;
        uVar9 = local_88;
        if (fVar8 != FDB_RESULT_SUCCESS) {
          pfVar23 = handle->file;
          pcVar25 = 
          "Error in appending a doc block metadata for a block id %lu into a database file \'%s\'";
          *(undefined8 *)((long)puVar13 + -0x10) = 2;
          fVar22 = *(fdb_log_levels *)((long)puVar13 + -0x10);
          sVar15 = 0x135;
LAB_0010fab3:
          puVar18 = (ulong *)((long)puVar13 + -8);
          goto LAB_0010fab6;
        }
        pfVar23 = handle->file;
        bVar10 = handle->curblock;
        uVar29 = handle->curpos;
        uVar30 = local_50 & 0xffffffff;
        *(undefined8 *)((long)puVar13 + -0x10) = 1;
        pvVar28 = local_60;
        uVar6 = *(undefined8 *)((long)puVar13 + -0x10);
        *(err_log_callback **)((long)puVar13 + -0x10) = peVar24;
        *(undefined8 *)((long)puVar13 + -0x18) = 0x10fb9a;
        fVar8 = filemgr_write_offset
                          (pfVar23,bVar10,(ulong)uVar29,uVar30,pvVar28,SUB81(uVar6,0),
                           *(err_log_callback **)((long)puVar13 + -0x10));
        if (fVar8 != FDB_RESULT_SUCCESS) {
          pfVar23 = handle->file;
          *(undefined8 *)((long)puVar13 + -0x10) = 2;
          fVar22 = *(fdb_log_levels *)((long)puVar13 + -0x10);
          sVar15 = 0x143;
          *(char **)((long)puVar13 + -0x10) = pfVar23->filename;
          *(uint64_t *)((long)puVar13 + -0x18) = uVar9;
          puVar17 = (ulong *)((long)puVar13 + -0x20);
          *(ulong *)((long)puVar13 + -0x20) = uVar27;
          goto LAB_0010f9a6;
        }
        size = uVar9 - uVar30;
        local_48 = local_48 * handle->curblock + (ulong)handle->curpos;
      }
    }
    begin = local_58 - 1;
    for (uVar27 = 0; puVar16 = local_78, uVar9 = local_80, local_58 != uVar27; uVar27 = uVar27 + 1)
    {
      bVar10 = local_78[uVar27];
      handle->curblock = bVar10;
      uVar1 = *(ushort *)(end + uVar27 * 2);
      handle->cur_bmp_revnum_hash = uVar1;
      uStack_90 = CONCAT62(uStack_90._2_6_,uVar1 << 8 | uVar1 >> 8);
      if (local_32._1_1_ == '\0') {
        pfVar23 = handle->file;
        *(undefined8 *)((long)puVar13 + -0x10) = 1;
        uVar14 = *(uint64_t *)((long)puVar13 + -0x10);
        puVar16 = &local_32;
      }
      else {
        *(undefined8 *)((long)puVar13 + -8) = 0xffffffffffffffff;
        uVar9 = local_b0;
        local_98 = *(ulong *)((long)puVar13 + -8);
        if (uVar27 < begin) {
          uVar30 = puVar16[uVar27 + 1];
          local_98 = uVar30 >> 0x38 | (uVar30 & 0xff000000000000) >> 0x28 |
                     (uVar30 & 0xff0000000000) >> 0x18 | (uVar30 & 0xff00000000) >> 8 |
                     (uVar30 & 0xff000000) << 8 | (uVar30 & 0xff0000) << 0x18 |
                     (uVar30 & 0xff00) << 0x28 | uVar30 << 0x38;
        }
        pfVar23 = handle->file;
        *(undefined8 *)((long)puVar13 + -0x10) = 0x10;
        uVar14 = *(uint64_t *)((long)puVar13 + -0x10);
        puVar16 = &local_98;
      }
      *(err_log_callback **)((long)puVar13 + -0x10) = peVar24;
      *(undefined8 *)((long)puVar13 + -0x18) = 0x10f7e0;
      fVar8 = filemgr_write_offset
                        (pfVar23,bVar10,uVar9,uVar14,puVar16,false,
                         *(err_log_callback **)((long)puVar13 + -0x10));
      uVar9 = local_68;
      bVar2 = begin;
      if (fVar8 != FDB_RESULT_SUCCESS) {
        pfVar23 = handle->file;
        pcVar25 = 
        "Error in appending a doc block marker for a block id %lu into a database file \'%s\'";
        *(undefined8 *)((long)puVar13 + -0x10) = 2;
        fVar22 = *(fdb_log_levels *)((long)puVar13 + -0x10);
        sVar15 = 0x1b3;
        *(char **)((long)puVar13 + -0x10) = pfVar23->filename;
        puVar19 = (undefined1 *)((long)puVar13 + -0x18);
        *(bid_t *)((long)puVar13 + -0x18) = bVar10;
        goto LAB_0010fac0;
      }
      local_70 = bVar10;
      local_88 = size;
      uVar30 = local_50 & 0xffffffff;
      bVar31 = size < local_68;
      size = size - local_68;
      if (bVar31) {
        if (begin != uVar27) {
          *(undefined8 *)((long)puVar13 + -8) = 0x10f833;
          fdb_assert_die("i==block_list_size-1",
                         "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                         ,0x1cb,uVar27,bVar2);
        }
        peVar24 = local_40;
        bVar10 = local_70;
        size = local_88;
        pfVar23 = handle->file;
        pvVar28 = (void *)(uVar30 + (long)local_60);
        *(err_log_callback **)((long)puVar13 + -0x10) = local_40;
        *(undefined8 *)((long)puVar13 + -0x18) = 0x10f85f;
        fVar8 = filemgr_write_offset
                          (pfVar23,bVar10,0,size,pvVar28,false,
                           *(err_log_callback **)((long)puVar13 + -0x10));
        if (fVar8 != FDB_RESULT_SUCCESS) {
          pfVar23 = handle->file;
          pcVar25 = "Error in writing a doc block with id %lu, size %lu to a database file \'%s\'";
          *(undefined8 *)((long)puVar13 + -8) = 2;
          fVar22 = *(fdb_log_levels *)((long)puVar13 + -8);
          sVar15 = 0x1d5;
          *(char **)((long)puVar13 + -8) = pfVar23->filename;
          *(uint64_t *)((long)puVar13 + -0x10) = size;
          puVar19 = (undefined1 *)((long)puVar13 + -0x18);
          *(bid_t *)((long)puVar13 + -0x18) = bVar10;
          goto LAB_0010fac0;
        }
        uVar26 = (uint32_t)size;
        handle->curpos = uVar26;
        *(undefined8 *)((long)puVar13 + -8) = 0x10f87d;
        fVar8 = _docio_fill_zero(handle,bVar10,size & 0xffffffff);
        if (fVar8 != FDB_RESULT_SUCCESS) goto LAB_0010facb;
      }
      else {
        pfVar23 = handle->file;
        pvVar28 = (void *)(uVar30 + (long)local_60);
        *(undefined8 *)((long)puVar13 + -0x10) = 1;
        uVar6 = *(undefined8 *)((long)puVar13 + -0x10);
        *(err_log_callback **)((long)puVar13 + -0x10) = local_40;
        *(undefined8 *)((long)puVar13 + -0x18) = 0x10f8af;
        fVar8 = filemgr_write_offset
                          (pfVar23,bVar10,0,uVar9,pvVar28,SUB81(uVar6,0),
                           *(err_log_callback **)((long)puVar13 + -0x10));
        if (fVar8 != FDB_RESULT_SUCCESS) {
          pfVar23 = handle->file;
          pcVar25 = 
          "Error in writing an entire doc block with id %lu, size %lu to a database file \'%s\'";
          *(undefined8 *)((long)puVar13 + -8) = 2;
          peVar24 = local_40;
          fVar22 = *(fdb_log_levels *)((long)puVar13 + -8);
          sVar15 = 0x1c2;
          *(char **)((long)puVar13 + -8) = pfVar23->filename;
          *(uint64_t *)((long)puVar13 + -0x10) = uVar9;
          puVar19 = (undefined1 *)((long)puVar13 + -0x18);
          *(bid_t *)((long)puVar13 + -0x18) = local_70;
          goto LAB_0010fac0;
        }
        uVar26 = (uint32_t)uVar9;
        handle->curpos = uVar26;
        peVar24 = local_40;
      }
      local_50 = (ulong)((int)local_50 + uVar26);
    }
  }
  else {
    if (local_32._1_1_ == '\0') {
      pfVar23 = handle->file;
      bVar10 = handle->curblock;
      uVar9 = 1;
      puVar13 = &local_32;
      uVar14 = local_80;
    }
    else {
      puVar13 = &local_98;
      local_98 = 0xffffffffffffffff;
      pfVar23 = handle->file;
      bVar10 = handle->curblock;
      uVar9 = 0x10;
      uVar14 = local_b0;
    }
    puVar18 = &uStack_d0;
    bStack_e0 = 0x10f904;
    fVar8 = filemgr_write_offset(pfVar23,bVar10,uVar14,uVar9,puVar13,false,local_40);
    peVar24 = local_40;
    if (fVar8 == FDB_RESULT_SUCCESS) {
      bStack_e0 = 0x10f967;
      fVar8 = filemgr_write_offset
                        (handle->file,handle->curblock,uVar27,size,local_60,uVar30 == size,local_40)
      ;
      puVar13 = &uStack_c8;
      if (fVar8 == FDB_RESULT_SUCCESS) {
        uVar29 = (int)size + handle->curpos;
        handle->curpos = uVar29;
        uStack_d0 = 0x10fb2d;
        fVar8 = _docio_fill_zero(handle,handle->curblock,(ulong)uVar29);
        if (fVar8 == FDB_RESULT_SUCCESS) {
          return local_48 * handle->curblock + uVar27;
        }
      }
      else {
        fVar22 = 2;
        sVar15 = 0xb5;
        bStack_e0 = size;
        puVar17 = &uStack_e8;
        uStack_e8 = uVar27;
LAB_0010f9a6:
        *(bid_t *)((long)puVar17 + -8) = handle->curblock;
        *(char **)((long)puVar17 + -0x10) =
             "Error in writing a doc block with id %lu, offset %d, size %lu to a database file \'%s\'"
        ;
        *(undefined8 *)((long)puVar17 + -0x18) = 0x10f9b0;
        fdb_log_impl(peVar24,fVar22,fVar8,
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                     ,"docio_append_doc_raw",sVar15,*(char **)((long)puVar17 + -0x10));
        puVar13 = (ulong *)((long)puVar17 + 0x20);
      }
    }
    else {
      pfVar23 = handle->file;
      pcVar25 = 
      "Error in appending a doc block marker for a block id %lu into a database file \'%s\'";
      fVar22 = 2;
      sVar15 = 0xac;
LAB_0010fab6:
      *(char **)((long)puVar18 + -8) = pfVar23->filename;
      puVar19 = (undefined1 *)((long)puVar18 + -0x10);
      *(bid_t *)((long)puVar18 + -0x10) = handle->curblock;
LAB_0010fac0:
      puVar20 = (undefined8 *)(puVar19 + -8);
      *(char **)(puVar19 + -8) = pcVar25;
LAB_0010fac2:
      puVar20[-1] = 0x10fac7;
      fdb_log_impl(peVar24,fVar22,fVar8,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                   ,"docio_append_doc_raw",sVar15,(char *)*puVar20);
      puVar13 = puVar20 + 4;
    }
LAB_0010facb:
    *(undefined8 *)((long)puVar13 + -8) = 0xffffffffffffffff;
    local_48 = *(bid_t *)((long)puVar13 + -8);
  }
  return local_48;
}

Assistant:

bid_t docio_append_doc_raw(struct docio_handle *handle, uint64_t size, void *buf)
{
    uint32_t offset;
    uint8_t marker[BLK_MARKER_SIZE];
    size_t blocksize = handle->file->blocksize;
    size_t real_blocksize = blocksize;
    size_t remaining_space;
    err_log_callback *log_callback = handle->log_callback;
    bool non_consecutive = ver_non_consecutive_doc(handle->file->version);
    struct docblk_meta blk_meta;

    memset(&blk_meta, 0x0, sizeof(blk_meta));
    blk_meta.marker = BLK_MARKER_DOC;
    (void)blk_meta;

#ifdef __CRC32
    if (non_consecutive) {
        // new version: support non-consecutive document block
        blocksize -= DOCBLK_META_SIZE;
    } else {
        // old version: block marker only
        blocksize -= BLK_MARKER_SIZE;
    }
    memset(marker, BLK_MARKER_DOC, BLK_MARKER_SIZE);
#endif

    if (handle->curblock == BLK_NOT_FOUND) {
        // allocate new block
        handle->cur_bmp_revnum_hash =
            filemgr_get_sb_bmp_revnum(handle->file) & BMP_REVNUM_MASK;
        handle->curblock = filemgr_alloc(handle->file, log_callback);
        handle->curpos = 0;
    }
    if (!filemgr_is_writable(handle->file, handle->curblock)) {
        // mark remaining space in old block as stale
        if (handle->curpos < real_blocksize) {
            // this function will calculate block marker size automatically.
            filemgr_mark_stale(handle->file,
                               real_blocksize * handle->curblock + handle->curpos,
                               blocksize - handle->curpos);
        }
        // allocate new block
        handle->cur_bmp_revnum_hash =
            filemgr_get_sb_bmp_revnum(handle->file) & BMP_REVNUM_MASK;
        handle->curblock = filemgr_alloc(handle->file, log_callback);
        handle->curpos = 0;
    }
    blk_meta.sb_bmp_revnum_hash = _endian_encode(handle->cur_bmp_revnum_hash);

    remaining_space = blocksize - handle->curpos;
    if (size <= remaining_space) {
        fdb_status fs = FDB_RESULT_SUCCESS;
        // simply append to current block
        offset = handle->curpos;

        if (non_consecutive) {
            // set next BID
            blk_meta.next_bid = BLK_NOT_FOUND;
            // write meta
            fs = filemgr_write_offset(handle->file, handle->curblock,
                                      blocksize, sizeof(blk_meta), &blk_meta,
                                      false, log_callback);
        } else {
            fs = _add_blk_marker(handle->file, handle->curblock, blocksize, marker,
                                 log_callback);
        }


        if (fs != FDB_RESULT_SUCCESS) {
            fdb_log(log_callback, FDB_LOG_ERROR, fs,
                    "Error in appending a doc block marker for a block id %" _F64
                    " into a database file '%s'", handle->curblock,
                    handle->file->filename);
            return BLK_NOT_FOUND;
        }
        fs = filemgr_write_offset(handle->file, handle->curblock, offset, size,
                                  buf, (size == remaining_space), log_callback);
        if (fs != FDB_RESULT_SUCCESS) {
            fdb_log(log_callback, FDB_LOG_ERROR, fs,
                    "Error in writing a doc block with id %" _F64 ", offset %d, size %"
                    _F64 " to a database file '%s'", handle->curblock, offset, size,
                    handle->file->filename);
            return BLK_NOT_FOUND;
        }
        handle->curpos += size;

        if (_docio_fill_zero(handle, handle->curblock, handle->curpos) !=
            FDB_RESULT_SUCCESS) {
            return BLK_NOT_FOUND;
        }

        return handle->curblock * real_blocksize + offset;

    } else { // insufficient space to fit entire document into current block
        bid_t begin, end, i, startpos;
        bid_t *block_list, block_list_size = 0;
        uint16_t *bmp_revnum_list;
        uint32_t nblock = size / blocksize;
        uint32_t remain = size % blocksize;
        uint64_t remainsize = size;
        fdb_status fs = FDB_RESULT_SUCCESS;

        // as blocks may not be consecutive, we need to maintain
        // the list of BIDs.
        block_list = (bid_t *)alca(bid_t, nblock+1);
        bmp_revnum_list = (uint16_t *)alca(uint16_t, nblock+1);

#ifdef DOCIO_BLOCK_ALIGN
        offset = blocksize - handle->curpos;
        if (remain <= blocksize - handle->curpos &&
            filemgr_alloc_multiple_cond(handle->file, handle->curblock+1,
                                        nblock + ((remain>offset)?1:0), &begin, &end,
                                        log_callback) == handle->curblock+1) {

            // start from current block
            if (begin != (handle->curblock + 1)) {
                fdb_log(log_callback, FDB_LOG_ERROR, fs,
                        "Error in allocating blocks starting from block id %" _F64
                        " in a database file '%s'", handle->curblock + 1,
                        handle->file->filename);
                return BLK_NOT_FOUND;
            }

            fs = _add_blk_marker(handle->file, handle->curblock, blocksize,
                                 marker, log_callback);
            if (fs != FDB_RESULT_SUCCESS) {
                fdb_log(log_callback, FDB_LOG_ERROR, fs,
                        "Error in appending a doc block marker for a block id %" _F64
                        " into a database file '%s'", handle->curblock,
                        handle->file->filename);
                return BLK_NOT_FOUND;
            }
            if (offset > 0) {
                fs = filemgr_write_offset(handle->file, handle->curblock,
                                          handle->curpos, offset, buf,
                                          true, // mark block as immutable
                                          log_callback);
                if (fs != FDB_RESULT_SUCCESS) {
                    fdb_log(log_callback, FDB_LOG_ERROR, fs,
                            "Error in writing a doc block with id %" _F64 ", offset %d, "
                            "size %" _F64 " to a database file '%s'", handle->curblock,
                            offset, size, handle->file->filename);
                    return BLK_NOT_FOUND;
                }
            }
            remainsize -= offset;

            startpos = handle->curblock * real_blocksize + handle->curpos;
        } else {
            // next block to be allocated is not continuous .. allocate new multiple blocks
            filemgr_alloc_multiple(handle->file, nblock+((remain>0)?1:0),
                                   &begin, &end, log_callback);
            offset = 0;

            startpos = begin * real_blocksize;
        }

#else
        // Simple append mode
        // The given doc is appended at the byte offset right next the last doc.
        // Note that block allocation can be non-consecutive.
        offset = blocksize - handle->curpos;

        if (non_consecutive) {
            // new version: support non-consecutive allocation

            bool new_block = false;
            bool start_from_new_block = false;

            if (remain > offset) {
                // if the current block cannot accommodate the remaining length
                // of the document, allocate an additional block.
                new_block = true;
            }

            block_list_size = nblock + ((new_block)?1:0);
            for (i=0; i<block_list_size; ++i) {
                bmp_revnum_list[i] = filemgr_get_sb_bmp_revnum(handle->file) &
                                     BMP_REVNUM_MASK;
                block_list[i] = filemgr_alloc(handle->file, log_callback);

                if (i == 0 && handle->curblock != BLK_NOT_FOUND &&
                    block_list[i] > handle->curblock+1) {
                    // if the first new allocated block is not consecutive
                    // from the current block, start writing document from
                    // the new block.
                    start_from_new_block = true;
                    // since we won't write into the current block,
                    // allocate one more block if necessary.
                    if (remain && !new_block) {
                        new_block = true;
                        block_list_size++;
                    }
                }
            }

            if (offset > 0 && !start_from_new_block) {
                // start from the current block

                // set next BID
                blk_meta.next_bid = _endian_encode(block_list[0]);
                // write meta
                fs = filemgr_write_offset(handle->file, handle->curblock,
                                          blocksize, sizeof(blk_meta), &blk_meta,
                                          false, log_callback);
                if (fs != FDB_RESULT_SUCCESS) {
                    fdb_log(log_callback, FDB_LOG_ERROR, fs,
                            "Error in appending a doc block metadata for a block id %" _F64
                            " into a database file '%s'", handle->curblock,
                            handle->file->filename);
                    return BLK_NOT_FOUND;
                }

                // write the front part of the doc
                if (offset > 0) {
                    fs = filemgr_write_offset(handle->file, handle->curblock,
                                              handle->curpos, offset, buf,
                                              true, // mark block as immutable
                                              log_callback);
                    if (fs != FDB_RESULT_SUCCESS) {
                        fdb_log(log_callback, FDB_LOG_ERROR, fs,
                                "Error in writing a doc block with id %" _F64 ", offset %d, "
                                "size %" _F64 " to a database file '%s'", handle->curblock,
                                offset, size, handle->file->filename);
                        return BLK_NOT_FOUND;
                    }
                }
                remainsize -= offset;

                startpos = handle->curblock * real_blocksize + handle->curpos;
            } else {
                // mark remaining space in the current block as stale
                if (handle->curblock != BLK_NOT_FOUND &&
                    handle->curpos < real_blocksize) {
                    filemgr_mark_stale(handle->file,
                                       real_blocksize * handle->curblock + handle->curpos,
                                       blocksize - handle->curpos);
                }
                offset = 0;
                startpos = block_list[0] * real_blocksize;
            }

        } else {
            // old version: consecutive allocation only

            if (filemgr_alloc_multiple_cond(handle->file, handle->curblock+1,
                                            nblock + ((remain>offset)?1:0), &begin, &end,
                                            log_callback) == handle->curblock+1) {
                // start from current block
                if (begin != (handle->curblock + 1)) {
                    fdb_log(log_callback, FDB_LOG_ERROR, fs,
                            "Error in allocating blocks starting from block id %" _F64
                            " in a database file '%s'", handle->curblock + 1,
                            handle->file->filename);
                    return BLK_NOT_FOUND;
                }

                fs = _add_blk_marker(handle->file, handle->curblock, blocksize,
                                     marker, log_callback);
                if (fs != FDB_RESULT_SUCCESS) {
                    fdb_log(log_callback, FDB_LOG_ERROR, fs,
                            "Error in appending a doc block marker for a block id %" _F64
                            " into a database file '%s'", handle->curblock,
                            handle->file->filename);
                    return BLK_NOT_FOUND;
                }
                if (offset > 0) {
                    fs = filemgr_write_offset(handle->file, handle->curblock,
                                              handle->curpos, offset, buf,
                                              true, // mark block as immutable
                                              log_callback);
                    if (fs != FDB_RESULT_SUCCESS) {
                        fdb_log(log_callback, FDB_LOG_ERROR, fs,
                                "Error in writing a doc block with id %" _F64 ", offset %d, "
                                "size %" _F64 " to a database file '%s'", handle->curblock,
                                offset, size, handle->file->filename);
                        return BLK_NOT_FOUND;
                    }
                }
                remainsize -= offset;

                startpos = handle->curblock * real_blocksize + handle->curpos;
            } else {
                // next block to be allocated is not continuous
                // mark remaining space in the old block as stale
                if (handle->curblock != BLK_NOT_FOUND &&
                    handle->curpos < real_blocksize) {
                    filemgr_mark_stale(handle->file,
                                       real_blocksize * handle->curblock + handle->curpos,
                                       blocksize - handle->curpos);
                }
                // allocate new multiple blocks
                filemgr_alloc_multiple(handle->file, nblock+((remain>0)?1:0),
                                       &begin, &end, log_callback);
                offset = 0;

                startpos = begin * real_blocksize;
            }

            block_list_size = end - begin + 1;
            for (i=0; i<block_list_size; ++i) {
                block_list[i] = begin+i;
            }

        } // if (non_consecutive)

#endif

        for (i=0; i<block_list_size; ++i) {
            handle->curblock = block_list[i];
            handle->cur_bmp_revnum_hash = bmp_revnum_list[i];
            blk_meta.sb_bmp_revnum_hash = _endian_encode(handle->cur_bmp_revnum_hash);

            if (non_consecutive) {
                if (i < block_list_size - 1) {
                    blk_meta.next_bid = _endian_encode(block_list[i+1]);
                } else {
                    // the last block .. set next BID '0xffff...'
                    memset(&blk_meta.next_bid, 0xff, sizeof(blk_meta.next_bid));
                }
            }

            // write meta (new) or block marker (old)
            if (non_consecutive) {
                fs = filemgr_write_offset(handle->file, handle->curblock,
                                          blocksize, sizeof(blk_meta), &blk_meta,
                                          false, log_callback);
            } else {
                fs = _add_blk_marker(handle->file, block_list[i], blocksize, marker,
                                     log_callback);
            }
            if (fs != FDB_RESULT_SUCCESS) {
                fdb_log(log_callback, FDB_LOG_ERROR, fs,
                        "Error in appending a doc block marker for a block "
                        "id %" _F64 " into a database file '%s'", block_list[i],
                        handle->file->filename);
                return BLK_NOT_FOUND;
            }

            if (remainsize >= blocksize) {
                // write entire block

                fs = filemgr_write_offset(handle->file, block_list[i], 0, blocksize,
                                          (uint8_t *)buf + offset,
                                          true, // mark block as immutable
                                          log_callback);
                if (fs != FDB_RESULT_SUCCESS) {
                    fdb_log(log_callback, FDB_LOG_ERROR, fs,
                            "Error in writing an entire doc block with id %" _F64
                            ", size %" _F64 " to a database file '%s'", block_list[i], blocksize,
                            handle->file->filename);
                    return BLK_NOT_FOUND;
                }
                offset += blocksize;
                remainsize -= blocksize;
                handle->curpos = blocksize;

            } else {
                // write rest of document
                fdb_assert(i==block_list_size-1, i, block_list_size-1);

                fs = filemgr_write_offset(handle->file, block_list[i], 0, remainsize,
                                          (uint8_t *)buf + offset,
                                          (remainsize == blocksize),
                                          log_callback);
                if (fs != FDB_RESULT_SUCCESS) {
                    fdb_log(log_callback, FDB_LOG_ERROR, fs,
                            "Error in writing a doc block with id %" _F64 ", "
                            "size %" _F64 " to a database file '%s'", block_list[i], remainsize,
                            handle->file->filename);
                    return BLK_NOT_FOUND;
                }
                offset += remainsize;
                handle->curpos = remainsize;

                if (_docio_fill_zero(handle, block_list[i], handle->curpos) !=
                    FDB_RESULT_SUCCESS) {
                    return BLK_NOT_FOUND;
                }
            }
        }

        return startpos;
    }

    return 0;
}